

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakePolicyCommand::HandleGetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  PolicyStatus PVar2;
  long lVar3;
  ostream *poVar4;
  PolicyID id;
  char *value;
  bool parent_scope;
  cmMakefile *pcVar5;
  pointer pbVar6;
  PolicyID pid;
  string local_1c0;
  ostringstream e;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6;
  if (lVar3 == 0x80) {
    bVar1 = std::operator==(pbVar6 + 3,"PARENT_SCOPE");
    pbVar6 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    parent_scope = true;
    if (!bVar1) {
      lVar3 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6;
      goto LAB_0018c1fb;
    }
  }
  else {
LAB_0018c1fb:
    if (lVar3 != 0x60) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"GET must be given exactly 2 additional arguments.",
                 (allocator<char> *)&local_1c0);
      cmCommand::SetError(&this->super_cmCommand,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      return false;
    }
    parent_scope = false;
  }
  bVar1 = cmPolicies::GetPolicyID(pbVar6[1]._M_dataplus._M_p,&pid);
  if (bVar1) {
    PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,pid,parent_scope);
    if (REQUIRED_ALWAYS < PVar2) {
      return bVar1;
    }
    switch(PVar2) {
    case OLD:
      pcVar5 = (this->super_cmCommand).Makefile;
      value = "OLD";
      break;
    case WARN:
      pcVar5 = (this->super_cmCommand).Makefile;
      value = "";
      break;
    case NEW:
      pcVar5 = (this->super_cmCommand).Makefile;
      value = "NEW";
      break;
    default:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1c0,(cmPolicies *)(ulong)pid,id);
      poVar4 = std::operator<<((ostream *)&e,(string *)&local_1c0);
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"The call to cmake_policy(GET ");
      poVar4 = std::operator<<(poVar4,(string *)(pbVar6 + 1));
      poVar4 = std::operator<<(poVar4," ...) at which this ");
      poVar4 = std::operator<<(poVar4,
                               "error appears requests the policy, and this version of CMake ");
      std::operator<<(poVar4,"requires that the policy be set to NEW before it is checked.");
      std::__cxx11::string::~string((string *)&local_1c0);
      pcVar5 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_1c0);
      goto LAB_0018c399;
    }
    cmMakefile::AddDefinition(pcVar5,pbVar6 + 2,value);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"GET given policy \"");
    poVar4 = std::operator<<(poVar4,(string *)(pbVar6 + 1));
    poVar4 = std::operator<<(poVar4,"\" which is not known to this ");
    std::operator<<(poVar4,"version of CMake.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1c0);
LAB_0018c399:
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return bVar1;
}

Assistant:

bool cmCMakePolicyCommand::HandleGetMode(std::vector<std::string> const& args)
{
  bool parent_scope = false;
  if (args.size() == 4 && args[3] == "PARENT_SCOPE") {
    // Undocumented PARENT_SCOPE option for use within CMake.
    parent_scope = true;
  } else if (args.size() != 3) {
    this->SetError("GET must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    std::ostringstream e;
    e << "GET given policy \"" << id << "\" which is not known to this "
      << "version of CMake.";
    this->SetError(e.str());
    return false;
  }

  // Lookup the policy setting.
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(pid, parent_scope);
  switch (status) {
    case cmPolicies::OLD:
      // Report that the policy is set to OLD.
      this->Makefile->AddDefinition(var, "OLD");
      break;
    case cmPolicies::WARN:
      // Report that the policy is not set.
      this->Makefile->AddDefinition(var, "");
      break;
    case cmPolicies::NEW:
      // Report that the policy is set to NEW.
      this->Makefile->AddDefinition(var, "NEW");
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      // The policy is required to be set before anything needs it.
      {
        std::ostringstream e;
        e << cmPolicies::GetRequiredPolicyError(pid) << "\n"
          << "The call to cmake_policy(GET " << id << " ...) at which this "
          << "error appears requests the policy, and this version of CMake "
          << "requires that the policy be set to NEW before it is checked.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      }
  }

  return true;
}